

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_4tap_8x2_half_pel_avx2(int16_t *src,__m256i *coeffs,__m256i *s_256,__m256i *r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __m256i s1;
  __m256i s0;
  __m256i *in_RCX;
  undefined1 (*in_RDX) [32];
  undefined8 in_RSI;
  long in_RDI;
  __m256i a_256 [2];
  __m256i *in_stack_ffffffffffffff08;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x28);
  uVar2 = *(undefined8 *)(in_RDI + 0x30);
  uVar3 = *(undefined8 *)(in_RDI + 0x38);
  *(undefined8 *)in_RDX[2] = *(undefined8 *)(in_RDI + 0x20);
  *(undefined8 *)(in_RDX[2] + 8) = uVar1;
  *(undefined8 *)(in_RDX[2] + 0x10) = uVar2;
  *(undefined8 *)(in_RDX[2] + 0x18) = uVar3;
  uVar1 = *(undefined8 *)(in_RDI + 0x38);
  uVar2 = *(undefined8 *)(in_RDI + 0x40);
  uVar3 = *(undefined8 *)(in_RDI + 0x48);
  *(undefined8 *)in_RDX[3] = *(undefined8 *)(in_RDI + 0x30);
  *(undefined8 *)(in_RDX[3] + 8) = uVar1;
  *(undefined8 *)(in_RDX[3] + 0x10) = uVar2;
  *(undefined8 *)(in_RDX[3] + 0x18) = uVar3;
  vpaddw_avx2(*in_RDX,in_RDX[3]);
  vpaddw_avx2(in_RDX[1],in_RDX[2]);
  s0[1] = *(undefined8 *)in_RDX[2];
  s0[0] = (longlong)(in_RDI + 0x20);
  s0[2] = *(undefined8 *)(in_RDX[2] + 8);
  s0[3] = *(longlong *)(in_RDX[2] + 0x10);
  s1[1] = in_RSI;
  s1[0] = (longlong)in_RDX;
  s1[2] = in_RDI;
  s1[3] = (longlong)(in_RDI + 0x30);
  xy_y_convolve_2tap_16_avx2(s0,s1,in_RCX,in_stack_ffffffffffffff08);
  uVar1 = *(undefined8 *)(in_RDX[2] + 8);
  uVar2 = *(undefined8 *)(in_RDX[2] + 0x10);
  uVar3 = *(undefined8 *)(in_RDX[2] + 0x18);
  *(undefined8 *)*in_RDX = *(undefined8 *)in_RDX[2];
  *(undefined8 *)(*in_RDX + 8) = uVar1;
  *(undefined8 *)(*in_RDX + 0x10) = uVar2;
  *(undefined8 *)(*in_RDX + 0x18) = uVar3;
  uVar1 = *(undefined8 *)(in_RDX[3] + 8);
  uVar2 = *(undefined8 *)(in_RDX[3] + 0x10);
  uVar3 = *(undefined8 *)(in_RDX[3] + 0x18);
  *(undefined8 *)in_RDX[1] = *(undefined8 *)in_RDX[3];
  *(undefined8 *)(in_RDX[1] + 8) = uVar1;
  *(undefined8 *)(in_RDX[1] + 0x10) = uVar2;
  *(undefined8 *)(in_RDX[1] + 0x18) = uVar3;
  return;
}

Assistant:

static inline void xy_y_convolve_4tap_8x2_half_pel_avx2(
    const int16_t *const src, const __m256i coeffs[1], __m256i s_256[4],
    __m256i r[2]) {
  __m256i a_256[2];
  s_256[2] = _mm256_loadu_si256((__m256i *)(src + 2 * 8));
  s_256[3] = _mm256_loadu_si256((__m256i *)(src + 3 * 8));
  a_256[0] = _mm256_add_epi16(s_256[0], s_256[3]);
  a_256[1] = _mm256_add_epi16(s_256[1], s_256[2]);
  xy_y_convolve_2tap_16_avx2(a_256[0], a_256[1], coeffs, r);
  s_256[0] = s_256[2];
  s_256[1] = s_256[3];
}